

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork_enums.h
# Opt level: O0

char * MLActivationParamsNonlinearityType_Name(MLActivationParamsNonlinearityType x)

{
  char *pcStack_10;
  MLActivationParamsNonlinearityType x_local;
  
  switch(x) {
  case MLActivationParamsNonlinearityType_NOT_SET:
    pcStack_10 = "INVALID";
    break;
  default:
    pcStack_10 = "INVALID";
    break;
  case MLActivationParamsNonlinearityType_linear:
    pcStack_10 = "MLActivationParamsNonlinearityType_linear";
    break;
  case MLActivationParamsNonlinearityType_ReLU:
    pcStack_10 = "MLActivationParamsNonlinearityType_ReLU";
    break;
  case MLActivationParamsNonlinearityType_leakyReLU:
    pcStack_10 = "MLActivationParamsNonlinearityType_leakyReLU";
    break;
  case MLActivationParamsNonlinearityType_thresholdedReLU:
    pcStack_10 = "MLActivationParamsNonlinearityType_thresholdedReLU";
    break;
  case MLActivationParamsNonlinearityType_PReLU:
    pcStack_10 = "MLActivationParamsNonlinearityType_PReLU";
    break;
  case MLActivationParamsNonlinearityType_tanh:
    pcStack_10 = "MLActivationParamsNonlinearityType_tanh";
    break;
  case MLActivationParamsNonlinearityType_scaledTanh:
    pcStack_10 = "MLActivationParamsNonlinearityType_scaledTanh";
    break;
  case MLActivationParamsNonlinearityType_sigmoid:
    pcStack_10 = "MLActivationParamsNonlinearityType_sigmoid";
    break;
  case MLActivationParamsNonlinearityType_sigmoidHard:
    pcStack_10 = "MLActivationParamsNonlinearityType_sigmoidHard";
    break;
  case MLActivationParamsNonlinearityType_ELU:
    pcStack_10 = "MLActivationParamsNonlinearityType_ELU";
    break;
  case MLActivationParamsNonlinearityType_softsign:
    pcStack_10 = "MLActivationParamsNonlinearityType_softsign";
    break;
  case MLActivationParamsNonlinearityType_softplus:
    pcStack_10 = "MLActivationParamsNonlinearityType_softplus";
    break;
  case MLActivationParamsNonlinearityType_parametricSoftplus:
    pcStack_10 = "MLActivationParamsNonlinearityType_parametricSoftplus";
  }
  return pcStack_10;
}

Assistant:

__attribute__((__unused__))
static const char * MLActivationParamsNonlinearityType_Name(MLActivationParamsNonlinearityType x) {
    switch (x) {
        case MLActivationParamsNonlinearityType_linear:
            return "MLActivationParamsNonlinearityType_linear";
        case MLActivationParamsNonlinearityType_ReLU:
            return "MLActivationParamsNonlinearityType_ReLU";
        case MLActivationParamsNonlinearityType_leakyReLU:
            return "MLActivationParamsNonlinearityType_leakyReLU";
        case MLActivationParamsNonlinearityType_thresholdedReLU:
            return "MLActivationParamsNonlinearityType_thresholdedReLU";
        case MLActivationParamsNonlinearityType_PReLU:
            return "MLActivationParamsNonlinearityType_PReLU";
        case MLActivationParamsNonlinearityType_tanh:
            return "MLActivationParamsNonlinearityType_tanh";
        case MLActivationParamsNonlinearityType_scaledTanh:
            return "MLActivationParamsNonlinearityType_scaledTanh";
        case MLActivationParamsNonlinearityType_sigmoid:
            return "MLActivationParamsNonlinearityType_sigmoid";
        case MLActivationParamsNonlinearityType_sigmoidHard:
            return "MLActivationParamsNonlinearityType_sigmoidHard";
        case MLActivationParamsNonlinearityType_ELU:
            return "MLActivationParamsNonlinearityType_ELU";
        case MLActivationParamsNonlinearityType_softsign:
            return "MLActivationParamsNonlinearityType_softsign";
        case MLActivationParamsNonlinearityType_softplus:
            return "MLActivationParamsNonlinearityType_softplus";
        case MLActivationParamsNonlinearityType_parametricSoftplus:
            return "MLActivationParamsNonlinearityType_parametricSoftplus";
        case MLActivationParamsNonlinearityType_NOT_SET:
            return "INVALID";
    }
    return "INVALID";
}